

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__get16be(stbi__context *s)

{
  stbi_uc sVar1;
  int iVar2;
  stbi_uc *psVar3;
  stbi_uc *psVar4;
  stbi_uc sVar5;
  
  psVar4 = s->img_buffer;
  psVar3 = s->img_buffer_end;
  if (psVar4 < psVar3) {
    s->img_buffer = psVar4 + 1;
    sVar5 = *psVar4;
    psVar4 = psVar4 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    sVar5 = '\0';
  }
  else {
    psVar4 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar3 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar5 = '\0';
    }
    else {
      psVar3 = psVar4 + iVar2;
      sVar5 = *psVar4;
    }
    s->img_buffer_end = psVar3;
    psVar4 = s->buffer_start + 1;
    s->img_buffer = psVar4;
  }
  if (psVar4 < psVar3) {
    s->img_buffer = psVar4 + 1;
    sVar1 = *psVar4;
  }
  else if (s->read_from_callbacks == 0) {
    sVar1 = '\0';
  }
  else {
    psVar3 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar4 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar1 = '\0';
    }
    else {
      psVar4 = psVar3 + iVar2;
      sVar1 = *psVar3;
    }
    s->img_buffer_end = psVar4;
    s->img_buffer = s->buffer_start + 1;
  }
  return (uint)CONCAT11(sVar5,sVar1);
}

Assistant:

static int stbi__get16be(stbi__context* s)
{
    int z = stbi__get8(s);
    return (z << 8) + stbi__get8(s);
}